

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

string * __thiscall
cmCryptoHash::FinalizeHex_abi_cxx11_(string *__return_storage_ptr__,cmCryptoHash *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  cmCryptoHash *local_18;
  cmCryptoHash *this_local;
  
  local_18 = this;
  this_local = (cmCryptoHash *)__return_storage_ptr__;
  Finalize(&local_30,this);
  ByteHashToString_abi_cxx11_(__return_storage_ptr__,(cmCryptoHash *)&local_30,hash);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHash::FinalizeHex()
{
  return cmCryptoHash::ByteHashToString(this->Finalize());
}